

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcargscontext.cpp
# Opt level: O2

Error __thiscall
asmjit::FuncArgsContext::initWorkData
          (FuncArgsContext *this,FuncFrame *frame,FuncArgsAssignment *args,
          RAConstraints *constraints)

{
  WorkData *this_00;
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  FuncDetail *this_01;
  Error EVar5;
  bool bVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  FuncValue *pFVar13;
  FuncValue *pFVar14;
  size_t argIndex;
  uint32_t *puVar15;
  ulong uVar16;
  uint uVar17;
  ArchTraits *this_02;
  uint32_t valueIndex;
  size_t valueIndex_00;
  uint uVar18;
  int iVar19;
  WorkData *pWVar20;
  bool bVar21;
  long lStack_90;
  Error local_80;
  
  bVar2 = frame->_arch;
  this_01 = args->_funcDetail;
  lVar11 = (ulong)(bVar2 & 0x7f) * 0xd4;
  this->_archTraits = (ArchTraits *)(_archTraits + lVar11);
  this->_constraints = constraints;
  this->_arch = bVar2;
  this_00 = this->_workData;
  for (lVar12 = 7; lVar12 != 0x47; lVar12 = lVar12 + 0x10) {
    *(uint32_t *)(this->_workData[0]._reserved + lVar12 * 4 + -0x36) =
         constraints->_availableRegs[0];
    constraints = (RAConstraints *)((long)constraints + 4);
  }
  if ((frame->_attributes & 0x10) != 0) {
    this_00->_archRegs =
         this_00->_archRegs &
         (-2 << (_archTraits[lVar11 + 1] & 0x1f) |
         0xfffffffeU >> 0x20 - (_archTraits[lVar11 + 1] & 0x1f));
  }
  EVar5 = 3;
  uVar16 = 0;
  for (argIndex = 0; uVar10 = (uint)uVar16, argIndex != 0x10; argIndex = argIndex + 1) {
    for (valueIndex_00 = 0; uVar10 = (uint)uVar16, valueIndex_00 != 4;
        valueIndex_00 = valueIndex_00 + 1) {
      pFVar13 = FuncArgsAssignment::arg(args,argIndex,valueIndex_00);
      if ((pFVar13->_data & 0x300) != 0) {
        pFVar14 = FuncDetail::arg(this_01,argIndex,valueIndex_00);
        uVar18 = pFVar14->_data;
        if ((uVar18 & 0x300) != 0) {
          this->_vars[uVar16].cur._data = uVar18;
          uVar9 = pFVar13->_data;
          this->_vars[uVar16].out._data = uVar9;
          if ((uVar18 >> 10 & 1) == 0) {
            if ((uVar9 >> 8 & 1) == 0) {
              uVar18 = uVar18 & 0xff;
              uVar17 = uVar9 & 0xff;
              if ((uVar9 & 0xff) == 0) {
                this->_vars[uVar16].out._data = uVar9 | uVar18;
                uVar17 = uVar18;
              }
              uVar7 = Type::sizeOf(uVar17);
              uVar8 = Type::sizeOf(uVar18);
              if (uVar8 < uVar7) {
                uVar8 = uVar7;
              }
              if ((uint)((bVar2 & 1) == 0) * 4 + 4 < uVar8) {
                if (uVar17 - 0x20 < 10 && uVar18 - 0x20 < 10) {
LAB_0011564d:
                  lStack_90 = 0x2c;
                  goto LAB_00115650;
                }
                if (uVar8 < 9) {
                  iVar19 = *(int *)(_archTraits + lVar11 + 0x3c);
                  if (iVar19 == 0) {
LAB_0011571f:
                    iVar19 = *(int *)(_archTraits + lVar11 + 0x40);
                    if (iVar19 == 0) goto LAB_00115736;
                  }
                }
                else {
                  if (uVar8 < 0x11) goto LAB_0011571f;
                  if (0x20 < uVar8) {
                    lStack_90 = 0x48;
                    if (0x40 < uVar8) goto LAB_0011577a;
                    goto LAB_00115650;
                  }
LAB_00115736:
                  iVar19 = *(int *)(_archTraits + lVar11 + 0x44);
                  lStack_90 = 0x48;
                  if (iVar19 == 0) goto LAB_00115650;
                }
              }
              else {
                lStack_90 = 0x28;
                if (4 < uVar8) goto LAB_0011564d;
LAB_00115650:
                iVar19 = *(int *)(((ArchTraits *)(_archTraits + lVar11))->_reserved + lStack_90 + -4
                                 );
                if (iVar19 == 0) goto LAB_0011577a;
              }
              this->_stackDstMask =
                   this->_stackDstMask | (byte)(1 << ((byte)((uint)iVar19 >> 8) & 0xf));
              uVar18 = 0xff;
              pWVar20 = (WorkData *)0x0;
              uVar8 = 0xffffffff;
            }
            else {
              if (0x1fffffff < uVar9) {
LAB_0011576d:
                EVar5 = 0x1c;
                goto LAB_0011577a;
              }
              uVar18 = uVar9 >> 0x18;
              this_02 = this->_archTraits;
              if (this_02->_regInfo[uVar18]._signature == 0) goto LAB_0011576d;
              if ((char)uVar9 == '\0') {
                uVar8 = ArchTraits::regTypeToTypeId(this_02,uVar18);
                this->_vars[uVar16].out._data = this->_vars[uVar16].out._data & 0xffffff00 | uVar8;
                this_02 = this->_archTraits;
              }
              uVar8 = ArchTraits::regTypeToGroup(this_02,uVar18);
              if (3 < uVar8) {
                EVar5 = 0x1d;
                goto LAB_0011577a;
              }
              bVar3 = *(byte *)((long)&this->_vars[uVar16].out._data + 2);
              uVar18 = (uint)bVar3;
              if (0x1f < bVar3) {
LAB_00115a4b:
                EVar5 = 0x1e;
                goto LAB_0011577a;
              }
              pWVar20 = this_00 + uVar8;
              uVar9 = 1 << (bVar3 & 0x1f);
              if ((pWVar20->_archRegs >> (bVar3 & 0x1f) & 1) == 0) goto LAB_00115a4b;
              if ((pWVar20->_dstRegs & uVar9) != 0) {
                EVar5 = 0x41;
                goto LAB_0011577a;
              }
              pWVar20->_dstRegs = pWVar20->_dstRegs | uVar9;
              pWVar20->_dstShuf = pWVar20->_dstShuf | uVar9;
              pWVar20->_usedRegs = pWVar20->_usedRegs | uVar9;
            }
            uVar9 = this->_vars[uVar16].cur._data;
            if ((uVar9 >> 8 & 1) == 0) {
              if (pWVar20 != (WorkData *)0x0) {
                pWVar20->_numStackArgs = pWVar20->_numStackArgs + '\x01';
              }
              this->_hasStackSrc = true;
            }
            else {
              uVar17 = uVar9 >> 0x10 & 0xff;
              uVar7 = ArchTraits::regTypeToGroup(this->_archTraits,uVar9 >> 0x18);
              if (uVar8 == uVar7) {
                WorkData::assign(pWVar20,uVar10,uVar17);
                if (uVar18 == uVar17) {
                  pbVar1 = (byte *)((long)&this->_vars[uVar16].cur._data + 1);
                  *pbVar1 = *pbVar1 | 8;
                }
              }
              else {
                if (3 < uVar7) goto LAB_0011577a;
                WorkData::assign(this_00 + uVar7,uVar10,uVar17);
              }
            }
            uVar16 = (ulong)(uVar10 + 1);
            goto LAB_00115712;
          }
          EVar5 = 0x1a;
        }
LAB_0011577a:
        if (argIndex < 0x10) {
          return EVar5;
        }
        goto LAB_00115789;
      }
LAB_00115712:
    }
  }
LAB_00115789:
  puVar15 = &this->_workData[0]._dstRegs;
  for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
    uVar18 = ((WorkData *)(puVar15 + -4))->_archRegs;
    uVar8 = FuncFrame::dirtyRegs(frame,(uint32_t)lVar12);
    uVar7 = FuncFrame::preservedRegs(frame,(uint32_t)lVar12);
    puVar15[-3] = (~uVar7 | uVar8) & uVar18 | *puVar15 | puVar15[-1];
    puVar15 = puVar15 + 0x10;
  }
  if (this->_hasStackSrc == true) {
    if (frame->_finalStackAlignment < frame->_minDynamicAlignment) {
      bVar21 = false;
    }
    else {
      bVar21 = (frame->_attributes & 0x10) == 0;
    }
  }
  else {
    bVar21 = false;
  }
  bVar3 = frame->_saRegId;
  bVar4 = args->_saRegId;
  if ((bVar3 == 0xff) || (bVar6 = WorkData::isAssigned(this_00,(uint)bVar3), !bVar6)) {
    if (bVar4 == 0xff) {
      if (bVar21) goto LAB_0011585c;
    }
    else {
      if ((this->_workData[0]._dstRegs >> (bVar4 & 0x1f) & 1) != 0) goto LAB_00115838;
LAB_0011585c:
      bVar21 = (bVar2 & 1) == 0;
      this->_saVarId = (uint8_t)uVar10;
      this->_hasPreservedFP = (bool)((byte)frame->_attributes >> 4 & 1);
      this->_vars[uVar10].cur = 0;
      this->_vars[uVar10].out = 0;
      uVar18 = (uint)bVar4;
      uVar8 = (uint)bVar3;
      if ((bVar3 == 0xff) &&
         ((bVar4 == 0xff || (bVar6 = WorkData::isAssigned(this_00,uVar18), uVar8 = uVar18, bVar6))))
      {
        uVar9 = this->_workData[0]._workRegs;
        uVar17 = ~this->_workData[0]._assignedRegs & uVar9;
        if ((uVar17 == 0) && (uVar17 = ~uVar9 & this_00->_archRegs, uVar17 == 0)) {
          return 0x40;
        }
        uVar8 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
          }
        }
      }
      uVar17 = (uint)bVar21 * 0x1000000 + 0x5000000;
      iVar19 = (uint)bVar21 * 2 + 0x27;
      this->_vars[uVar10].cur._data = (uVar8 << 0x10 | uVar17) + iVar19 + 0x100;
      WorkData::assign(this_00,uVar10,uVar8);
      uVar9 = this->_workData[0]._workRegs | 1 << (uVar8 & 0x1f);
      this->_workData[0]._workRegs = uVar9;
      if (bVar4 == 0xff) {
        pbVar1 = (byte *)((long)&this->_vars[uVar10].cur._data + 1);
        *pbVar1 = *pbVar1 | 8;
      }
      else {
        this->_vars[uVar10].out._data = iVar19 + (uVar18 << 0x10 | uVar17) + 0x100;
        puVar15 = &this->_workData[0]._dstRegs;
        *puVar15 = *puVar15 | 1 << (bVar4 & 0x1f);
        this->_workData[0]._workRegs = uVar9 | 1 << (uVar18 & 0x1f);
      }
      uVar10 = uVar10 + 1;
    }
    this->_varCount = uVar10;
    local_80 = 0;
    for (uVar16 = 0; uVar16 < uVar10; uVar16 = uVar16 + 1) {
      uVar10 = this->_vars[uVar16].cur._data;
      if (((uVar10 >> 8 & 1) != 0) &&
         (uVar18 = this->_vars[uVar16].out._data, (uVar18 >> 8 & 1) != 0)) {
        uVar8 = ArchTraits::regTypeToGroup(this->_archTraits,uVar10 >> 0x18);
        uVar7 = ArchTraits::regTypeToGroup
                          (this->_archTraits,
                           (uint)*(byte *)((long)&this->_vars[uVar16].out._data + 3));
        if (uVar8 == uVar7) {
          uVar18 = uVar18 >> 0x10 & 0xff;
          pWVar20 = this_00 + uVar8;
          bVar21 = WorkData::isAssigned(pWVar20,uVar18);
          if (bVar21) {
            bVar2 = pWVar20->_physToVarId[uVar18];
            uVar7 = ArchTraits::regTypeToGroup
                              (this->_archTraits,
                               (uint)*(byte *)((long)&this->_vars[bVar2].out._data + 3));
            if ((uVar7 == uVar8) && (((uVar10 ^ this->_vars[bVar2].out._data) & 0xff0000) == 0)) {
              pWVar20->_numSwaps = pWVar20->_numSwaps + '\x01';
              this->_regSwapsMask = this->_regSwapsMask | (byte)(1 << ((byte)uVar8 & 0x1f));
            }
          }
        }
      }
      uVar10 = this->_varCount;
    }
  }
  else {
LAB_00115838:
    local_80 = 0x41;
  }
  return local_80;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FuncArgsContext::initWorkData(const FuncFrame& frame, const FuncArgsAssignment& args, const RAConstraints* constraints) noexcept {
  // The code has to be updated if this changes.
  ASMJIT_ASSERT(BaseReg::kGroupVirt == 4);

  uint32_t i;

  uint32_t arch = frame.arch();
  const FuncDetail& func = *args.funcDetail();

  _archTraits = &ArchTraits::byArch(arch);
  _constraints = constraints;
  _arch = uint8_t(arch);

  // Initialize `_archRegs`.
  for (i = 0; i < BaseReg::kGroupVirt; i++)
    _workData[i]._archRegs = _constraints->availableRegs(i);

  if (frame.hasPreservedFP())
    _workData[BaseReg::kGroupGp]._archRegs &= ~Support::bitMask(archTraits().fpRegId());

  // Extract information from all function arguments/assignments and build Var[] array.
  uint32_t varId = 0;
  for (uint32_t argIndex = 0; argIndex < Globals::kMaxFuncArgs; argIndex++) {
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      const FuncValue& dst_ = args.arg(argIndex, valueIndex);
      if (!dst_.isAssigned())
        continue;

      const FuncValue& src_ = func.arg(argIndex, valueIndex);
      if (ASMJIT_UNLIKELY(!src_.isAssigned()))
        return DebugUtils::errored(kErrorInvalidState);

      Var& var = _vars[varId];
      var.init(src_, dst_);

      FuncValue& src = var.cur;
      FuncValue& dst = var.out;

      uint32_t dstGroup = 0xFFFFFFFFu;
      uint32_t dstId = BaseReg::kIdBad;
      WorkData* dstWd = nullptr;

      // Not supported.
      if (src.isIndirect())
        return DebugUtils::errored(kErrorInvalidAssignment);

      if (dst.isReg()) {
        uint32_t dstType = dst.regType();
        if (ASMJIT_UNLIKELY(!archTraits().hasRegType(dstType)))
          return DebugUtils::errored(kErrorInvalidRegType);

        // Copy TypeId from source if the destination doesn't have it. The RA
        // used by BaseCompiler would never leave TypeId undefined, but users
        // of FuncAPI can just assign phys regs without specifying the type.
        if (!dst.hasTypeId())
          dst.setTypeId(archTraits().regTypeToTypeId(dst.regType()));

        dstGroup = archTraits().regTypeToGroup(dstType);
        if (ASMJIT_UNLIKELY(dstGroup >= BaseReg::kGroupVirt))
          return DebugUtils::errored(kErrorInvalidRegGroup);

        dstWd = &_workData[dstGroup];
        dstId = dst.regId();
        if (ASMJIT_UNLIKELY(dstId >= 32 || !Support::bitTest(dstWd->archRegs(), dstId)))
          return DebugUtils::errored(kErrorInvalidPhysId);

        if (ASMJIT_UNLIKELY(Support::bitTest(dstWd->dstRegs(), dstId)))
          return DebugUtils::errored(kErrorOverlappedRegs);

        dstWd->_dstRegs  |= Support::bitMask(dstId);
        dstWd->_dstShuf  |= Support::bitMask(dstId);
        dstWd->_usedRegs |= Support::bitMask(dstId);
      }
      else {
        if (!dst.hasTypeId())
          dst.setTypeId(src.typeId());

        RegInfo regInfo = getSuitableRegForMemToMemMove(arch, dst.typeId(), src.typeId());
        if (ASMJIT_UNLIKELY(!regInfo.isValid()))
          return DebugUtils::errored(kErrorInvalidState);
        _stackDstMask = uint8_t(_stackDstMask | Support::bitMask(regInfo.group()));
      }

      if (src.isReg()) {
        uint32_t srcId = src.regId();
        uint32_t srcGroup = archTraits().regTypeToGroup(src.regType());

        if (dstGroup == srcGroup) {
          dstWd->assign(varId, srcId);

          // The best case, register is allocated where it is expected to be.
          if (dstId == srcId)
            var.markDone();
        }
        else {
          if (ASMJIT_UNLIKELY(srcGroup >= BaseReg::kGroupVirt))
            return DebugUtils::errored(kErrorInvalidState);

          WorkData& srcData = _workData[srcGroup];
          srcData.assign(varId, srcId);
        }
      }
      else {
        if (dstWd)
          dstWd->_numStackArgs++;
        _hasStackSrc = true;
      }

      varId++;
    }
  }

  // Initialize WorkData::workRegs.
  for (i = 0; i < BaseReg::kGroupVirt; i++) {
    _workData[i]._workRegs = (_workData[i].archRegs() & (frame.dirtyRegs(i) | ~frame.preservedRegs(i))) | _workData[i].dstRegs() | _workData[i].assignedRegs();
  }

  // Create a variable that represents `SARegId` if necessary.
  bool saRegRequired = _hasStackSrc && frame.hasDynamicAlignment() && !frame.hasPreservedFP();

  WorkData& gpRegs = _workData[BaseReg::kGroupGp];
  uint32_t saCurRegId = frame.saRegId();
  uint32_t saOutRegId = args.saRegId();

  if (saCurRegId != BaseReg::kIdBad) {
    // Check if the provided `SARegId` doesn't collide with input registers.
    if (ASMJIT_UNLIKELY(gpRegs.isAssigned(saCurRegId)))
      return DebugUtils::errored(kErrorOverlappedRegs);
  }

  if (saOutRegId != BaseReg::kIdBad) {
    // Check if the provided `SARegId` doesn't collide with argument assignments.
    if (ASMJIT_UNLIKELY(Support::bitTest(gpRegs.dstRegs(), saOutRegId)))
      return DebugUtils::errored(kErrorOverlappedRegs);
    saRegRequired = true;
  }

  if (saRegRequired) {
    uint32_t ptrTypeId = Environment::is32Bit(arch) ? Type::kIdU32 : Type::kIdU64;
    uint32_t ptrRegType = Environment::is32Bit(arch) ? BaseReg::kTypeGp32 : BaseReg::kTypeGp64;

    _saVarId = uint8_t(varId);
    _hasPreservedFP = frame.hasPreservedFP();

    Var& var = _vars[varId];
    var.reset();

    if (saCurRegId == BaseReg::kIdBad) {
      if (saOutRegId != BaseReg::kIdBad && !gpRegs.isAssigned(saOutRegId)) {
        saCurRegId = saOutRegId;
      }
      else {
        uint32_t availableRegs = gpRegs.availableRegs();
        if (!availableRegs)
          availableRegs = gpRegs.archRegs() & ~gpRegs.workRegs();

        if (ASMJIT_UNLIKELY(!availableRegs))
          return DebugUtils::errored(kErrorNoMorePhysRegs);

        saCurRegId = Support::ctz(availableRegs);
      }
    }

    var.cur.initReg(ptrRegType, saCurRegId, ptrTypeId);
    gpRegs.assign(varId, saCurRegId);
    gpRegs._workRegs |= Support::bitMask(saCurRegId);

    if (saOutRegId != BaseReg::kIdBad) {
      var.out.initReg(ptrRegType, saOutRegId, ptrTypeId);
      gpRegs._dstRegs  |= Support::bitMask(saOutRegId);
      gpRegs._workRegs |= Support::bitMask(saOutRegId);
    }
    else {
      var.markDone();
    }

    varId++;
  }

  _varCount = varId;

  // Detect register swaps.
  for (varId = 0; varId < _varCount; varId++) {
    Var& var = _vars[varId];
    if (var.cur.isReg() && var.out.isReg()) {
      uint32_t srcId = var.cur.regId();
      uint32_t dstId = var.out.regId();

      uint32_t group = archTraits().regTypeToGroup(var.cur.regType());
      if (group != archTraits().regTypeToGroup(var.out.regType()))
        continue;

      WorkData& wd = _workData[group];
      if (wd.isAssigned(dstId)) {
        Var& other = _vars[wd._physToVarId[dstId]];
        if (archTraits().regTypeToGroup(other.out.regType()) == group && other.out.regId() == srcId) {
          wd._numSwaps++;
          _regSwapsMask = uint8_t(_regSwapsMask | Support::bitMask(group));
        }
      }
    }
  }

  return kErrorOk;
}